

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list_functions.h
# Opt level: O2

Token * LinkedList::delete_head<string_tokenizer::Token>
                  (Token *__return_storage_ptr__,Node<string_tokenizer::Token> **head)

{
  Node<string_tokenizer::Token> *this;
  
  this = *head;
  if (this == (Node<string_tokenizer::Token> *)0x0) {
    string_tokenizer::Token::Token(__return_storage_ptr__);
  }
  else {
    string_tokenizer::Token::Token(__return_storage_ptr__,&this->_item);
    *head = (*head)->_next;
    std::__cxx11::string::~string((string *)this);
    operator_delete(this);
  }
  return __return_storage_ptr__;
}

Assistant:

T delete_head(Node<T>*& head) {
        if (head == NULL) {
            return T();
        }
        Node<T>* hold = head;
        T hold_item = head->_item;
        head = head->_next;
        delete hold;
        return hold_item;
    }